

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatecode.c
# Opt level: O0

void generate_temp_decls(List *code)

{
  BOOL local_21c;
  BOOL local_218;
  BOOL found;
  BOOL decld [128];
  List *code_local;
  
  local_21c = FALSE;
  memset(&local_218,0,0x200);
  gtd_aux(code,&local_218,&local_21c);
  if (local_21c != FALSE) {
    fputs(";\n",(FILE *)syn68k_c_stream);
  }
  return;
}

Assistant:

static void
generate_temp_decls (List *code)
{
#if	!defined(TEMPS_AT_TOP)
  BOOL decld[128];
  BOOL found = FALSE;
  memset (decld, 0, sizeof decld);
  gtd_aux (code, decld, &found);
  if (found)
    fputs (";\n", syn68k_c_stream);
#endif
}